

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O0

void __thiscall
HandleInfo<XrSenseDataSnapshotBD_T_*>::removeHandlesForInstance
          (HandleInfo<XrSenseDataSnapshotBD_T_*> *this,GenValidUsageXrInstanceInfo *search_value)

{
  anon_class_8_1_3c46da18 local_30;
  undefined1 local_28 [8];
  UniqueLock lock;
  GenValidUsageXrInstanceInfo *search_value_local;
  HandleInfo<XrSenseDataSnapshotBD_T_*> *this_local;
  
  lock._8_8_ = search_value;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,
             &(this->super_HandleInfoBase<XrSenseDataSnapshotBD_T_*,_GenValidUsageXrHandleInfo>).
              dispatch_mutex_);
  local_30.search_value = (GenValidUsageXrInstanceInfo *)lock._8_8_;
  map_erase_if<std::unordered_map<XrSenseDataSnapshotBD_T*,std::unique_ptr<GenValidUsageXrHandleInfo,std::default_delete<GenValidUsageXrHandleInfo>>,std::hash<XrSenseDataSnapshotBD_T*>,std::equal_to<XrSenseDataSnapshotBD_T*>,std::allocator<std::pair<XrSenseDataSnapshotBD_T*const,std::unique_ptr<GenValidUsageXrHandleInfo,std::default_delete<GenValidUsageXrHandleInfo>>>>>,HandleInfo<XrSenseDataSnapshotBD_T*>::removeHandlesForInstance(GenValidUsageXrInstanceInfo*)::_lambda(std::pair<XrSenseDataSnapshotBD_T*const,std::unique_ptr<GenValidUsageXrHandleInfo,std::default_delete<GenValidUsageXrHandleInfo>>>const&)_1_>
            ((unordered_map<XrSenseDataSnapshotBD_T_*,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>,_std::hash<XrSenseDataSnapshotBD_T_*>,_std::equal_to<XrSenseDataSnapshotBD_T_*>,_std::allocator<std::pair<XrSenseDataSnapshotBD_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>_>
              *)this,&local_30);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

inline void HandleInfo<HandleType>::removeHandlesForInstance(GenValidUsageXrInstanceInfo *search_value) {
    typedef typename base_t::value_t value_t;
    UniqueLock lock(this->dispatch_mutex_);
    map_erase_if(this->info_map_, [=](value_t const &data) { return data.second && data.second->instance_info == search_value; });
}